

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O1

void verifyOrthonormal<float>(Matrix44<float> *A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float *pfVar17;
  long lVar18;
  long lVar19;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  undefined8 local_34;
  float local_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  fVar1 = A->x[1][0];
  fVar2 = A->x[3][0];
  fVar3 = A->x[1][1];
  fVar4 = A->x[3][1];
  fVar5 = A->x[1][2];
  fVar6 = A->x[3][2];
  fVar7 = A->x[1][3];
  fVar8 = A->x[3][3];
  local_2c = fVar7 * fVar8 + fVar5 * fVar6 + fVar1 * fVar2 + fVar3 * fVar4;
  fVar9 = A->x[2][1];
  fVar10 = A->x[2][0];
  fVar13 = A->x[0][2];
  fVar11 = A->x[2][2];
  fVar14 = A->x[0][3];
  fVar12 = A->x[2][3];
  fVar15 = A->x[0][1];
  fVar16 = A->x[0][0];
  fStack_44 = fVar7 * fVar14 + fVar5 * fVar13 + fVar1 * fVar16 + fVar3 * fVar15;
  fStack_40 = fVar12 * fVar14 + fVar11 * fVar13 + fVar10 * fVar16 + fVar9 * fVar15;
  fStack_3c = fVar8 * fVar14 + fVar6 * fVar13 + fVar2 * fVar16 + fVar4 * fVar15;
  pfVar17 = &local_48;
  local_48 = fVar14 * fVar14 + fVar13 * fVar13 + fVar16 * fVar16 + fVar15 * fVar15;
  local_38 = fStack_44;
  fStack_24 = fVar12 * fVar7 + fVar11 * fVar5 + fVar10 * fVar1 + fVar9 * fVar3;
  fStack_1c = fVar8 * fVar12 + fVar6 * fVar11 + fVar2 * fVar10 + fVar4 * fVar9;
  local_34 = CONCAT44(fStack_24,fVar7 * fVar7 + fVar5 * fVar5 + fVar1 * fVar1 + fVar3 * fVar3);
  local_28 = fStack_40;
  fStack_20 = fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10 + fVar9 * fVar9;
  local_18 = fStack_3c;
  local_14 = local_2c;
  local_10 = fStack_1c;
  local_c = fVar8 * fVar8 + fVar6 * fVar6 + fVar2 * fVar2 + fVar4 * fVar4;
  lVar18 = 0;
  do {
    lVar19 = 0;
    do {
      if (lVar18 == lVar19) {
        if (1.1920929e-05 < ABS(pfVar17[lVar19] + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x30,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = float]");
        }
      }
      else if (1.1920929e-05 < ABS(pfVar17[lVar19])) {
        __assert_fail("std::abs (prod[i][j]) <= valueEps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x32,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 4);
    lVar18 = lVar18 + 1;
    pfVar17 = pfVar17 + 4;
  } while (lVar18 != 4);
  return;
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    const T valueEps = T (100) * std::numeric_limits<T>::epsilon ();

    const IMATH_INTERNAL_NAMESPACE::Matrix44<T> prod = A * A.transposed ();
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) <= valueEps);
            else
                assert (std::abs (prod[i][j]) <= valueEps);
        }
    }
}